

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-get.c
# Opt level: O0

cn_cbor * cn_cbor_mapget_int(cn_cbor *cb,int key)

{
  bool bVar1;
  cn_cbor *local_28;
  cn_cbor *cp;
  int key_local;
  cn_cbor *cb_local;
  
  if (cb == (cn_cbor *)0x0) {
    __assert_fail("cb",
                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/cn-cbor/repo/src/cn-get.c"
                  ,0xc,"cn_cbor *cn_cbor_mapget_int(const cn_cbor *, int)");
  }
  local_28 = cb->first_child;
  while( true ) {
    bVar1 = false;
    if (local_28 != (cn_cbor *)0x0) {
      bVar1 = local_28->next != (cn_cbor *)0x0;
    }
    if (!bVar1) break;
    if (local_28->type == CN_CBOR_UINT) {
      if ((local_28->v).bytes == (uint8_t *)(long)key) {
        return local_28->next;
      }
    }
    else if ((local_28->type == CN_CBOR_INT) && ((local_28->v).bytes == (uint8_t *)(long)key)) {
      return local_28->next;
    }
    local_28 = local_28->next->next;
  }
  return (cn_cbor *)0x0;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_mapget_int(const cn_cbor* cb, int key) {
  cn_cbor* cp;
  assert(cb);
  for (cp = cb->first_child; cp && cp->next; cp = cp->next->next) {
    switch(cp->type) {
    case CN_CBOR_UINT:
      if (cp->v.uint == (unsigned long)key) {
        return cp->next;
      }
      break;
    case CN_CBOR_INT:
      if (cp->v.sint == (long)key) {
        return cp->next;
      }
      break;
    default:
      ; // skip non-integer keys
    }
  }
  return NULL;
}